

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

VP8Decoder * VP8New(void)

{
  VP8Decoder *dec_00;
  WebPWorkerInterface *pWVar1;
  VP8Decoder *dec;
  uint64_t in_stack_00000008;
  
  dec_00 = (VP8Decoder *)WebPSafeCalloc(in_stack_00000008,(size_t)dec);
  if (dec_00 != (VP8Decoder *)0x0) {
    SetOk(dec_00);
    pWVar1 = WebPGetWorkerInterface();
    (*pWVar1->Init)(&dec_00->worker);
    dec_00->ready = 0;
    dec_00->num_parts_minus_one = 0;
    InitGetCoeffs();
  }
  return dec_00;
}

Assistant:

VP8Decoder* VP8New(void) {
  VP8Decoder* const dec = (VP8Decoder*)WebPSafeCalloc(1ULL, sizeof(*dec));
  if (dec != NULL) {
    SetOk(dec);
    WebPGetWorkerInterface()->Init(&dec->worker);
    dec->ready = 0;
    dec->num_parts_minus_one = 0;
    InitGetCoeffs();
  }
  return dec;
}